

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O3

Node<NimState> * __thiscall
MCTS::Node<NimState>::add_child(Node<NimState> *this,Move *move,TestGame *state)

{
  int iVar1;
  iterator __position;
  int *piVar2;
  int *piVar3;
  Node<NimState> *pNVar4;
  pointer ppNVar5;
  int *piVar6;
  Node<NimState> *node;
  Node<NimState> *local_28;
  
  pNVar4 = (Node<NimState> *)operator_new(0x60);
  pNVar4->move = *move;
  pNVar4->parent = this;
  pNVar4->player_to_move = state->player_to_move;
  pNVar4->wins = 0.0;
  pNVar4->visits = 0;
  NimState::get_moves(&pNVar4->moves,(NimState *)state);
  (pNVar4->children).
  super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar4->UCT_score = 0.0;
  (pNVar4->children).
  super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar4->children).
  super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __position._M_current =
       (this->children).
       super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28 = pNVar4;
  if (__position._M_current ==
      (this->children).
      super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MCTS::Node<NimState>*,std::allocator<MCTS::Node<NimState>*>>::
    _M_realloc_insert<MCTS::Node<NimState>*const&>
              ((vector<MCTS::Node<NimState>*,std::allocator<MCTS::Node<NimState>*>> *)
               &this->children,__position,&local_28);
    ppNVar5 = (this->children).
              super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = pNVar4;
    ppNVar5 = (this->children).
              super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>.
              _M_impl.super__Vector_impl_data._M_finish + 1;
    (this->children).
    super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar5;
  }
  if ((this->children).
      super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppNVar5) {
    piVar2 = (this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar2 != piVar3) {
      iVar1 = *move;
      piVar6 = piVar2;
      do {
        if (*piVar6 == iVar1) {
          *piVar6 = piVar3[-1];
          piVar3[-1] = iVar1;
          std::vector<int,_std::allocator<int>_>::resize
                    (&this->moves,((long)piVar3 - (long)piVar2 >> 2) - 1);
          return local_28;
        }
        piVar6 = piVar6 + 1;
      } while (piVar6 != piVar3);
    }
    assertion_failed("itr != moves.end()",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0xf6);
  }
  assertion_failed("! children.empty()",
                   "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                   ,0xf2);
}

Assistant:

Node<State>* Node<State>::add_child(const Move& move, const State& state)
{
	auto node = new Node(state, move, this);
	children.push_back(node);
	attest( ! children.empty());

	auto itr = moves.begin();
	for (; itr != moves.end() && *itr != move; ++itr);
	attest(itr != moves.end());
	std::iter_swap(itr, moves.end() - 1);
	moves.resize(moves.size() - 1);
	return node;
}